

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binpac_buffer.cc
# Opt level: O3

void __thiscall binpac::FlowBuffer::NewData(FlowBuffer *this,const_byteptr begin,const_byteptr end)

{
  if (((this->orig_data_begin_ < this->orig_data_end_) && (this->chunked_ == true)) &&
     (0 < this->frame_length_)) {
    this->frame_length_ =
         this->frame_length_ + ((int)this->orig_data_begin_ - (int)this->orig_data_end_);
  }
  this->orig_data_begin_ = begin;
  this->orig_data_end_ = end;
  this->data_seq_at_orig_data_end_ = this->data_seq_at_orig_data_end_ + ((int)end - (int)begin);
  MarkOrCopy(this);
  return;
}

Assistant:

void FlowBuffer::ClearPreviousData()
	{
	// All previous data must have been processed or buffered already
	if ( orig_data_begin_ < orig_data_end_ )
		{
		BINPAC_ASSERT(buffer_n_ == 0);
		if ( chunked_ )
			{
			if ( frame_length_ > 0 )
				{
				frame_length_ -= (orig_data_end_ - orig_data_begin_);
				}
			orig_data_begin_ = orig_data_end_;
			}
		}
	}